

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

InplaceStr GetTypeConstructorName(InplaceStr functionName)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  InplaceStr IVar4;
  
  pcVar3 = functionName.end;
  pcVar2 = functionName.begin;
  pcVar1 = pcVar3;
  do {
    if (pcVar1 <= pcVar2) {
LAB_0016d111:
      IVar4.end = pcVar3;
      IVar4.begin = pcVar2;
      return IVar4;
    }
    if (*pcVar1 == '.') {
      pcVar2 = pcVar1 + 1;
      if (pcVar3 < pcVar2) {
        __assert_fail("strEnd >= strBegin",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                      ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
      }
      goto LAB_0016d111;
    }
    pcVar1 = pcVar1 + -1;
  } while( true );
}

Assistant:

InplaceStr GetTypeConstructorName(InplaceStr functionName)
{
	// TODO: add type scopes and lookup owner namespace
	for(const char *pos = functionName.end; pos > functionName.begin; pos--)
	{
		if(*pos == '.')
		{
			functionName = InplaceStr(pos + 1, functionName.end);
			break;
		}
	}

	return functionName;
}